

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

bool __thiscall DataSourceDOS::load(DataSourceDOS *this)

{
  uint uVar1;
  element_type *peVar2;
  uint8_t *puVar3;
  shared_ptr<Buffer> local_168;
  undefined1 local_158 [24];
  string local_140 [32];
  undefined1 local_120 [16];
  size_t size;
  PBuffer anim;
  DataEntry entry;
  size_t i;
  pointer local_e0;
  pointer local_d8;
  size_t entry_count;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  UnpackerTPWM unpacker;
  undefined1 local_28 [24];
  DataSourceDOS *this_local;
  
  local_28._16_8_ = this;
  uVar1 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[5])();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    std::make_shared<Buffer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
    std::shared_ptr<Buffer>::operator=(&this->spae,(shared_ptr<Buffer> *)local_28);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_28);
    std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)(local_70 + 0x10),&this->spae);
    UnpackerTPWM::UnpackerTPWM((UnpackerTPWM *)local_50,(shared_ptr<Buffer> *)(local_70 + 0x10));
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)(local_70 + 0x10));
    UnpackerTPWM::convert((UnpackerTPWM *)local_70);
    std::shared_ptr<Buffer>::operator=(&this->spae,(shared_ptr<Buffer> *)local_70);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"data",&local_99);
    Log::Logger::operator[]((Logger *)local_78,(string *)&Log::Verbose);
    Log::Stream::operator<<((Stream *)local_78,"Data file is compressed");
    Log::Stream::~Stream((Stream *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    UnpackerTPWM::~UnpackerTPWM((UnpackerTPWM *)local_50);
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->spae);
    uVar1 = Buffer::pop<unsigned_int>(peVar2);
    local_d8 = (pointer)(ulong)uVar1;
    i = 0;
    local_e0 = (pointer)0x0;
    std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::push_back
              (&this->entries,(value_type *)&i);
    for (entry.size = 0; entry.size < local_d8; entry.size = entry.size + 1) {
      peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->spae);
      Buffer::pop<unsigned_int>(peVar2);
      peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->spae);
      uVar1 = Buffer::pop<unsigned_int>(peVar2);
      anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar1;
      std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::push_back
                (&this->entries,
                 (value_type *)
                 &anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    fixup(this);
    get_object((DataSourceDOS *)&size,(size_t)this);
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &size);
    Buffer::set_endianess(peVar2,EndianessBig);
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &size);
    puVar3 = (uint8_t *)Buffer::get_size(peVar2);
    local_120._8_8_ = puVar3;
    peVar2 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &size);
    uVar1 = Buffer::pop<unsigned_int>(peVar2);
    if (puVar3 == (uint8_t *)(ulong)uVar1) {
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&size);
      Buffer::pop_tail((Buffer *)local_158);
      std::shared_ptr<Buffer>::operator=
                ((shared_ptr<Buffer> *)&size,(shared_ptr<Buffer> *)local_158);
      std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_158);
      std::shared_ptr<Buffer>::shared_ptr(&local_168,(shared_ptr<Buffer> *)&size);
      this_local._7_1_ =
           DataSourceLegacy::load_animation_table(&this->super_DataSourceLegacy,&local_168);
      std::shared_ptr<Buffer>::~shared_ptr(&local_168);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"data",(allocator<char> *)(local_158 + 0x17));
      Log::Logger::operator[]((Logger *)local_120,(string *)&Log::Error);
      Log::Stream::operator<<((Stream *)local_120,"Could not extract animation table.");
      Log::Stream::~Stream((Stream *)local_120);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0x17));
      this_local._7_1_ = 0;
    }
    local_158._16_4_ = 1;
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&size);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
DataSourceDOS::load() {
  if (!check()) {
    return false;
  }

  try {
    spae = std::make_shared<Buffer>(path);
  } catch (...) {
    return false;
  }

  // Check that data file is decompressed
  try {
    UnpackerTPWM unpacker(spae);
    spae = unpacker.convert();
    Log::Verbose["data"] << "Data file is compressed";
  }  catch (...) {
    Log::Verbose["data"] << "Data file is not compressed";
  }

  // Read the number of entries in the index table.
  // Some entries are undefined (size and offset are zero).
  size_t entry_count = spae->pop<uint32_t>();
  entries.push_back({0, 0});  // first entry is whole file itself, drop it
  for (size_t i = 0; i < entry_count; i++) {
    DataEntry entry;
    entry.size = spae->pop<uint32_t>();
    entry.offset = spae->pop<uint32_t>();
    entries.push_back(entry);
  }

  fixup();

  // The first uint32 is the byte length of the rest
  // of the table in big endian order.
  PBuffer anim = get_object(DATA_SERF_ANIMATION_TABLE);
  anim->set_endianess(Buffer::EndianessBig);
  size_t size = anim->get_size();
  if (size != anim->pop<uint32_t>()) {
    Log::Error["data"] << "Could not extract animation table.";
    return false;
  }
  anim = anim->pop_tail();

  return load_animation_table(anim);
}